

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

int helics::appendMessage(ActionMessage *multiMessage,ActionMessage *newMessage)

{
  action_t aVar1;
  ActionMessage *in_RDI;
  ActionMessage *this;
  int in_stack_ffffffffffffffbc;
  ActionMessage *in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar2;
  
  aVar1 = ActionMessage::action(in_RDI);
  if ((aVar1 == cmd_multi_message) && (in_RDI->counter < 0xff)) {
    in_RDI->counter = in_RDI->counter + 1;
    this = in_RDI;
    ActionMessage::to_string_abi_cxx11_
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    ActionMessage::setString
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffc8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    uVar2 = (uint)in_RDI->counter;
  }
  else {
    uVar2 = 0xffffffff;
  }
  return uVar2;
}

Assistant:

int appendMessage(ActionMessage& multiMessage, const ActionMessage& newMessage)
{
    if (multiMessage.action() == CMD_MULTI_MESSAGE) {
        if (multiMessage.counter < 255) {
            multiMessage.setString(multiMessage.counter++, newMessage.to_string());
            return multiMessage.counter;
        }
    }
    return (-1);
}